

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QPalette __thiscall
QWidgetPrivate::naturalWidgetPalette(QWidgetPrivate *this,ResolveMask inheritedMask)

{
  ColorGroup CVar1;
  QWidget *pQVar2;
  long lVar3;
  QPalettePrivate *pQVar4;
  byte bVar5;
  char cVar6;
  QPalette *pQVar7;
  undefined8 extraout_RDX;
  long in_FS_OFFSET;
  QPalette QVar8;
  QPalette local_58;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QWidget **)(inheritedMask + 8);
  bVar5 = QCoreApplication::testAttribute(AA_UseStyleSheetPropagationInWidgetStyles);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::palette((QApplication *)this,pQVar2);
  lVar3 = *(long *)&pQVar2->field_0x8;
  if (((bVar5 == 0) && ((*(uint *)(lVar3 + 0x248) & 2) != 0)) ||
     (((((pQVar2->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0 && ((*(byte *)(lVar3 + 0x246) & 1) == 0))
      && ((*(long *)(inheritedMask + 0x78) == 0 ||
          (*(long *)(*(long *)(inheritedMask + 0x78) + 0x10) == 0)))))) goto LAB_002f74c3;
  pQVar2 = *(QWidget **)(lVar3 + 0x10);
  if (pQVar2 == (QWidget *)0x0) {
    if ((*(long *)(inheritedMask + 0x78) == 0) ||
       (*(long *)(*(long *)(inheritedMask + 0x78) + 0x10) == 0)) goto LAB_002f74c3;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsWidget::palette((QGraphicsWidget *)local_48);
  }
  else {
    if ((byte)(~bVar5 & (*(byte *)(*(long *)&pQVar2->field_0x8 + 0x248) & 2) >> 1) != 0)
    goto LAB_002f74c3;
    QGuiApplication::palette();
    cVar6 = QPalette::isCopyOf((QPalette *)this);
    QPalette::~QPalette((QPalette *)local_48);
    if (cVar6 != '\0') {
      pQVar7 = QWidget::palette(pQVar2);
      QPalette::operator=((QPalette *)this,pQVar7);
      goto LAB_002f74c3;
    }
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = QWidget::palette(pQVar2);
    QPalette::QPalette((QPalette *)local_48,pQVar7);
  }
  QPalette::setResolveMask((ulonglong)local_48);
  QPalette::resolve(&local_58);
  CVar1 = *(ColorGroup *)&this->field_0x8;
  *(ColorGroup *)&this->field_0x8 = local_58.currentGroup;
  pQVar4 = *(QPalettePrivate **)this;
  *(QPalettePrivate **)this = local_58.d;
  local_58.d = pQVar4;
  local_58.currentGroup = CVar1;
  QPalette::~QPalette(&local_58);
  QPalette::~QPalette((QPalette *)local_48);
LAB_002f74c3:
  QPalette::setResolveMask((ulonglong)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar8._8_8_ = extraout_RDX;
    QVar8.d = (QPalettePrivate *)this;
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QPalette QWidgetPrivate::naturalWidgetPalette(QPalette::ResolveMask inheritedMask) const
{
    Q_Q(const QWidget);

    const bool useStyleSheetPropagationInWidgetStyles =
        QCoreApplication::testAttribute(Qt::AA_UseStyleSheetPropagationInWidgetStyles);

    QPalette naturalPalette = QApplication::palette(q);
    if ((!q->testAttribute(Qt::WA_StyleSheet) || useStyleSheetPropagationInWidgetStyles)
        && (!q->isWindow() || q->testAttribute(Qt::WA_WindowPropagation)
#if QT_CONFIG(graphicsview)
            || (extra && extra->proxyWidget)
#endif // QT_CONFIG(graphicsview)
            )) {
        if (QWidget *p = q->parentWidget()) {
            if (!p->testAttribute(Qt::WA_StyleSheet) || useStyleSheetPropagationInWidgetStyles) {
                if (!naturalPalette.isCopyOf(QGuiApplication::palette())) {
                    QPalette inheritedPalette = p->palette();
                    inheritedPalette.setResolveMask(inheritedMask);
                    naturalPalette = inheritedPalette.resolve(naturalPalette);
                } else {
                    naturalPalette = p->palette();
                }
            }
        }
#if QT_CONFIG(graphicsview)
        else if (extra && extra->proxyWidget) {
            QPalette inheritedPalette = extra->proxyWidget->palette();
            inheritedPalette.setResolveMask(inheritedMask);
            naturalPalette = inheritedPalette.resolve(naturalPalette);
        }
#endif // QT_CONFIG(graphicsview)
    }
    naturalPalette.setResolveMask(0);
    return naturalPalette;
}